

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::PopulateChildren
          (Node *this,TypeInfo *typeinfo)

{
  __node_base_ptr *this_00;
  byte bVar1;
  bool use_ints_for_enums;
  pointer ppNVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  pointer ppNVar3;
  pointer ppNVar4;
  bool bVar5;
  int iVar6;
  Node *__args_1;
  iterator iVar7;
  LogMessage *pLVar8;
  Type **ppTVar9;
  Node *pNVar10;
  NodeKind kind;
  int i;
  ulong uVar11;
  undefined1 local_180 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  orig_children_map;
  undefined1 local_128 [8];
  StatusOr<const_google::protobuf::Type_*> found_result;
  undefined8 local_f0;
  undefined1 local_e8 [32];
  bool local_c8;
  string *local_b0;
  ulong local_a8;
  Node *local_a0;
  undefined1 auStack_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  undefined1 auStack_78 [8];
  vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  new_children;
  Type *local_40;
  LogFinisher local_31;
  
  if (((((this->type_ != (Type *)0x0) &&
        (bVar5 = std::operator==((this->type_->name_).ptr_,"google.protobuf.Any"), !bVar5)) &&
       (bVar5 = std::operator==((this->type_->name_).ptr_,"google.protobuf.Struct"), !bVar5)) &&
      ((bVar5 = std::operator==((this->type_->name_).ptr_,"google.protobuf.Timestamp"), !bVar5 &&
       (bVar5 = std::operator==((this->type_->name_).ptr_,"google.protobuf.Duration"), !bVar5)))) &&
     (bVar5 = std::operator==((this->type_->name_).ptr_,"google.protobuf.Value"), !bVar5)) {
    auStack_78 = (undefined1  [8])0x0;
    new_children.
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_children.
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_180 = (undefined1  [8])&orig_children_map._M_h._M_rehash_policy._M_next_resize;
    orig_children_map._M_h._M_buckets = (__buckets_ptr)0x1;
    orig_children_map._M_h._M_bucket_count = 0;
    orig_children_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    orig_children_map._M_h._M_element_count._0_4_ = 0x3f800000;
    orig_children_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    orig_children_map._M_h._M_rehash_policy._4_4_ = 0;
    orig_children_map._M_h._M_rehash_policy._M_next_resize = 0;
    iVar6 = 0;
    while( true ) {
      local_e8._0_4_ = iVar6;
      ppNVar2 = (this->children_).
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->children_).
                        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3) <=
          (ulong)(long)iVar6) break;
      InsertIfNotPresent<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)local_180,&ppNVar2[iVar6]->name_,(second_type *)local_e8);
      iVar6 = local_e8._0_4_ + LOGLEVEL_WARNING;
    }
    uVar11 = 0;
    local_a0 = (Node *)&PTR__DataPiece_003e3c20;
    while( true ) {
      if ((this->type_->fields_).super_RepeatedPtrFieldBase.current_size_ <= (int)uVar11) break;
      __args_1 = (Node *)protobuf::internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<google::protobuf::Field>::TypeHandler>
                                   (&(this->type_->fields_).super_RepeatedPtrFieldBase,(int)uVar11);
      path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_98 = (undefined1  [8])0x0;
      path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      __first._M_current =
           (this->path_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->path_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__first._M_current != __last._M_current) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_98,
                   (const_iterator)0x0,__first,__last);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_98,((ArenaStringPtr *)&__args_1->type_)->ptr_);
      if (((this->field_scrub_callback_).super__Function_base._M_manager == (_Manager_type)0x0) ||
         (bVar5 = std::
                  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
                  ::operator()(&this->field_scrub_callback_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)auStack_98,(Field *)__args_1), !bVar5)) {
        iVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_180,((ArenaStringPtr *)&__args_1->type_)->ptr_);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          if ((__args_1->data_).field_2.i32_ == 0xb) {
            StringPiece::StringPiece<std::allocator<char>>
                      ((StringPiece *)&found_result.value_,
                       ((ArenaStringPtr *)&__args_1->kind_)->ptr_);
            (*typeinfo->_vptr_TypeInfo[2])(local_128,typeinfo,found_result.value_,local_f0);
            if (local_128._0_4_ == OK) {
              ppTVar9 = StatusOr<const_google::protobuf::Type_*>::value
                                  ((StatusOr<const_google::protobuf::Type_*> *)local_128);
              local_40 = *ppTVar9;
              pNVar10 = __args_1;
              bVar5 = IsMap((Field *)__args_1,local_40);
              if (!bVar5) goto LAB_00328c2c;
              local_40 = GetMapValueType(pNVar10,local_40,typeinfo);
              bVar5 = true;
              kind = MAP;
            }
            else {
              protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_e8,LOGLEVEL_WARNING,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/internal/default_value_objectwriter.cc"
                         ,0x163);
              pLVar8 = protobuf::internal::LogMessage::operator<<
                                 ((LogMessage *)local_e8,"Cannot resolve type \'");
              pLVar8 = protobuf::internal::LogMessage::operator<<
                                 (pLVar8,((ArenaStringPtr *)&__args_1->kind_)->ptr_);
              pLVar8 = protobuf::internal::LogMessage::operator<<(pLVar8,"\'.");
              protobuf::internal::LogFinisher::operator=(&local_31,pLVar8);
              protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e8);
              local_40 = (Type *)0x0;
LAB_00328c2c:
              bVar5 = false;
              kind = OBJECT;
            }
            std::__cxx11::string::~string((string *)&found_result);
            if (!bVar5) goto LAB_00328c4d;
          }
          else {
            kind = PRIMITIVE;
            local_40 = (Type *)0x0;
LAB_00328c4d:
            if (*(int *)((long)&(__args_1->data_).field_2 + 4) == 3) {
              kind = LIST;
            }
          }
          if ((kind != PRIMITIVE) || (*(int32 *)((long)&(__args_1->data_).field_2 + 0xc) == 0)) {
            pNVar10 = (Node *)operator_new(0xc0);
            bVar1 = this->preserve_proto_field_names_;
            local_b0 = *(string **)
                        ((long)&((ArenaStringPtr *)&__args_1->type_)->ptr_ +
                        (ulong)((bVar1 ^ 1) << 4));
            local_a8 = uVar11;
            if (kind == PRIMITIVE) {
              CreateDefaultDataPieceForField
                        ((DataPiece *)local_e8,(Field *)__args_1,typeinfo,this->use_ints_for_enums_)
              ;
              bVar1 = this->preserve_proto_field_names_;
            }
            else {
              local_e8._0_8_ = local_a0;
              local_e8._8_4_ = TYPE_NULL;
              local_e8._16_4_ = 0;
              local_c8 = false;
            }
            this_00 = &orig_children_map._M_h._M_single_bucket;
            bVar5 = this->suppress_empty_list_;
            use_ints_for_enums = this->use_ints_for_enums_;
            std::
            function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
            ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
                        *)this_00,&this->field_scrub_callback_);
            Node(pNVar10,local_b0,local_40,kind,(DataPiece *)local_e8,true,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_98,bVar5,(bool)(bVar1 & 1),use_ints_for_enums,
                 (FieldScrubCallBack *)this_00);
            std::_Function_base::~_Function_base((_Function_base *)this_00);
            local_e8._0_8_ = pNVar10;
            std::
            vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
            ::emplace_back<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>
                      ((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
                        *)auStack_78,(Node **)local_e8);
            uVar11 = local_a8;
          }
        }
        else {
          std::
          vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
          ::push_back((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                       *)auStack_78,
                      (this->children_).
                      super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      *(int *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                     ._M_cur + 0x28));
          (this->children_).
          super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_start
          [*(int *)((long)iVar7.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          ._M_cur + 0x28)] = (Node *)0x0;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_98);
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    uVar11 = 0;
    while( true ) {
      ppNVar2 = (this->children_).
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppNVar3 = (this->children_).
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppNVar3 - (long)ppNVar2 >> 3) <= uVar11) break;
      if (ppNVar2[uVar11] != (Node *)0x0) {
        std::
        vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
        ::insert((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                  *)auStack_78,(const_iterator)auStack_78,ppNVar2 + uVar11);
        (this->children_).
        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11] = (Node *)0x0;
      }
      uVar11 = uVar11 + 1;
    }
    ppNVar4 = (this->children_).
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->children_).
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_78;
    (this->children_).
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         new_children.
         super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->children_).
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         new_children.
         super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_78 = (undefined1  [8])ppNVar2;
    new_children.
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppNVar3;
    new_children.
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppNVar4;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_180);
    std::
    _Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ::~_Vector_base((_Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                     *)auStack_78);
  }
  return;
}

Assistant:

void DefaultValueObjectWriter::Node::PopulateChildren(
    const TypeInfo* typeinfo) {
  // Ignores well known types that don't require automatically populating their
  // primitive children. For type "Any", we only populate its children when the
  // "@type" field is set.
  // TODO(tsun): remove "kStructValueType" from the list. It's being checked
  //     now because of a bug in the tool-chain that causes the "oneof_index"
  //     of kStructValueType to not be set correctly.
  if (type_ == nullptr || type_->name() == kAnyType ||
      type_->name() == kStructType || type_->name() == kTimestampType ||
      type_->name() == kDurationType || type_->name() == kStructValueType) {
    return;
  }
  std::vector<Node*> new_children;
  std::unordered_map<std::string, int> orig_children_map;

  // Creates a map of child nodes to speed up lookup.
  for (int i = 0; i < children_.size(); ++i) {
    InsertIfNotPresent(&orig_children_map, children_[i]->name_, i);
  }

  for (int i = 0; i < type_->fields_size(); ++i) {
    const google::protobuf::Field& field = type_->fields(i);

    // This code is checking if the field to be added to the tree should be
    // scrubbed or not by calling the field_scrub_callback_ callback function.
    std::vector<std::string> path;
    if (!path_.empty()) {
      path.insert(path.begin(), path_.begin(), path_.end());
    }
    path.push_back(field.name());
    if (field_scrub_callback_ && field_scrub_callback_(path, &field)) {
      continue;
    }

    std::unordered_map<std::string, int>::iterator found =
        orig_children_map.find(field.name());
    // If the child field has already been set, we just add it to the new list
    // of children.
    if (found != orig_children_map.end()) {
      new_children.push_back(children_[found->second]);
      children_[found->second] = nullptr;
      continue;
    }

    const google::protobuf::Type* field_type = nullptr;
    bool is_map = false;
    NodeKind kind = PRIMITIVE;

    if (field.kind() == google::protobuf::Field::TYPE_MESSAGE) {
      kind = OBJECT;
      util::StatusOr<const google::protobuf::Type*> found_result =
          typeinfo->ResolveTypeUrl(field.type_url());
      if (!found_result.ok()) {
        // "field" is of an unknown type.
        GOOGLE_LOG(WARNING) << "Cannot resolve type '" << field.type_url() << "'.";
      } else {
        const google::protobuf::Type* found_type = found_result.value();
        is_map = IsMap(field, *found_type);

        if (!is_map) {
          field_type = found_type;
        } else {
          // If this field is a map, we should use the type of its "Value" as
          // the type of the child node.
          field_type = GetMapValueType(*found_type, typeinfo);
          kind = MAP;
        }
      }
    }

    if (!is_map &&
        field.cardinality() == google::protobuf::Field::CARDINALITY_REPEATED) {
      kind = LIST;
    }

    // If oneof_index() != 0, the child field is part of a "oneof", which means
    // the child field is optional and we shouldn't populate its default
    // primitive value.
    if (field.oneof_index() != 0 && kind == PRIMITIVE) continue;

    // If the child field is of primitive type, sets its data to the default
    // value of its type.
    std::unique_ptr<Node> child(
        new Node(preserve_proto_field_names_ ? field.name() : field.json_name(),
                 field_type, kind,
                 kind == PRIMITIVE ? CreateDefaultDataPieceForField(
                                         field, typeinfo, use_ints_for_enums_)
                                   : DataPiece::NullData(),
                 true, path, suppress_empty_list_, preserve_proto_field_names_,
                 use_ints_for_enums_, field_scrub_callback_));
    new_children.push_back(child.release());
  }
  // Adds all leftover nodes in children_ to the beginning of new_child.
  for (int i = 0; i < children_.size(); ++i) {
    if (children_[i] == nullptr) {
      continue;
    }
    new_children.insert(new_children.begin(), children_[i]);
    children_[i] = nullptr;
  }
  children_.swap(new_children);
}